

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O3

int __thiscall QHexView::copy(QHexView *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QHexDocument *pQVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  qsizetype qVar6;
  bool bVar7;
  undefined8 uVar8;
  void *__buf;
  QByteArrayView QVar9;
  undefined1 local_88 [16];
  QHexBuffer *pQStack_78;
  QByteArray local_68;
  QByteArray local_48;
  QByteArrayView local_28;
  
  uVar8 = QGuiApplication::clipboard();
  bVar7 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar7) {
    QHexCursor::selectedBytes((QByteArray *)local_88,this->m_hexcursor);
  }
  else {
    pQVar1 = this->m_hexdocument;
    __buf = (void *)QHexCursor::offset(this->m_hexcursor);
    QHexDocument::read((QHexDocument *)local_88,(int)pQVar1,__buf,1);
  }
  if ((char)dst != '\0') {
    QHexUtils::toHex(&local_68,(QByteArray *)local_88,' ');
    QByteArray::toUpper_helper(&local_48);
    qVar6 = local_48.d.size;
    pDVar5 = local_48.d.d;
    uVar4 = local_88._8_8_;
    uVar3 = local_88._0_8_;
    local_48.d.d = (Data *)local_88._0_8_;
    local_88._0_8_ = pDVar5;
    local_88._8_8_ = local_48.d.ptr;
    local_48.d.ptr = (char *)uVar4;
    local_48.d.size = (qsizetype)pQStack_78;
    pQStack_78 = (QHexBuffer *)qVar6;
    if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar3,1,8);
      }
    }
    piVar2 = (int *)CONCAT44(local_68.d.d._4_4_,local_68.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_68.d.d._4_4_,local_68.d.d._0_4_),1,8);
      }
    }
  }
  QByteArrayView::QByteArrayView<QByteArray,_true>(&local_28,(QByteArray *)local_88);
  QVar9.m_data = (storage_type *)local_28.m_size;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  local_68.d.d._0_4_ = local_48.d.d._0_4_;
  local_68.d.d._4_4_ = local_48.d.d._4_4_;
  local_68.d.ptr._0_4_ = local_48.d.ptr._0_4_;
  local_68.d.ptr._4_4_ = local_48.d.ptr._4_4_;
  local_68.d.size = local_48.d.size;
  QClipboard::setText(uVar8,&local_68,0);
  piVar2 = (int *)CONCAT44(local_68.d.d._4_4_,local_68.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_68.d.d._4_4_,local_68.d.d._0_4_),2,8);
    }
  }
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      local_88._0_8_ = QArrayData::deallocate((QArrayData *)local_88._0_8_,1,8);
    }
  }
  return (int)local_88._0_8_;
}

Assistant:

void QHexView::copy(bool hex) const {
    QClipboard* c = qApp->clipboard();

    QByteArray bytes = m_hexcursor->hasSelection()
                           ? m_hexcursor->selectedBytes()
                           : m_hexdocument->read(m_hexcursor->offset(), 1);

    if(hex)
        bytes = QHexUtils::toHex(bytes, ' ').toUpper();
    c->setText(bytes);
}